

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

uint aom_highbd_sad128x128_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  uint uVar1;
  uint uVar2;
  int left_shift;
  uint sum;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000028;
  uint8_t *in_stack_00000038;
  
  uVar1 = aom_highbd_sad128x64_avg_avx2
                    (in_stack_00000038,src._4_4_,(uint8_t *)CONCAT44(src_stride,in_stack_00000028),
                     ref._4_4_,(uint8_t *)CONCAT44(ref_stride,in_stack_00000018));
  uVar2 = aom_highbd_sad128x64_avg_avx2
                    (in_stack_00000038,src._4_4_,(uint8_t *)CONCAT44(src_stride,in_stack_00000028),
                     ref._4_4_,(uint8_t *)CONCAT44(ref_stride,in_stack_00000018));
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_highbd_sad128x128_avg_avx2(const uint8_t *src, int src_stride,
                                            const uint8_t *ref, int ref_stride,
                                            const uint8_t *second_pred) {
  unsigned int sum;
  const int left_shift = 6;

  sum = aom_highbd_sad128x64_avg_avx2(src, src_stride, ref, ref_stride,
                                      second_pred);
  src += src_stride << left_shift;
  ref += ref_stride << left_shift;
  second_pred += 128 << left_shift;
  sum += aom_highbd_sad128x64_avg_avx2(src, src_stride, ref, ref_stride,
                                       second_pred);
  return sum;
}